

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

void js_array_finalizer(JSRuntime *rt,JSValue val)

{
  void *pvVar1;
  int i;
  ulong uVar2;
  long lVar3;
  JSValue v;
  
  lVar3 = 8;
  for (uVar2 = 0; pvVar1 = *(void **)((long)val.u.ptr + 0x38),
      uVar2 < *(uint *)((long)val.u.ptr + 0x40); uVar2 = uVar2 + 1) {
    v.tag = *(int64_t *)((long)pvVar1 + lVar3);
    v.u.ptr = ((JSValueUnion *)((long)pvVar1 + lVar3 + -8))->ptr;
    JS_FreeValueRT(rt,v);
    lVar3 = lVar3 + 0x10;
  }
  (*(rt->mf).js_free)(&rt->malloc_state,pvVar1);
  return;
}

Assistant:

static void js_array_finalizer(JSRuntime *rt, JSValue val)
{
    JSObject *p = JS_VALUE_GET_OBJ(val);
    int i;

    for(i = 0; i < p->u.array.count; i++) {
        JS_FreeValueRT(rt, p->u.array.u.values[i]);
    }
    js_free_rt(rt, p->u.array.u.values);
}